

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

vector<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>_>
* __thiscall
adios2::core::Engine::DoAllRelativeStepsBlocksInfo
          (Engine *this,Variable<std::complex<float>_> *variable)

{
  vector<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>_>
  *in_RDI;
  string *in_stack_00000098;
  Engine *in_stack_000000a0;
  allocator local_39;
  string local_38 [56];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"DoAllRelativeStepsBlocksInfo",&local_39);
  ThrowUp(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  memset(in_RDI,0,0x18);
  std::
  vector<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>_>
  ::vector((vector<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>,_std::allocator<std::vector<adios2::core::Variable<std::complex<float>_>::BPInfo,_std::allocator<adios2::core::Variable<std::complex<float>_>::BPInfo>_>_>_>
            *)0x853aa1);
  return in_RDI;
}

Assistant:

std::map<size_t, std::vector<VariableStruct::BPInfo>>
Engine::DoAllStepsBlocksInfoStruct(const VariableStruct &variable) const
{
    ThrowUp("DoAllStepsBlocksInfo");
    return std::map<size_t, std::vector<VariableStruct::BPInfo>>();
}